

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ClassMethodDeclarationSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ClassMethodDeclarationSyntax *this,
          size_t index)

{
  FunctionDeclarationSyntax *node;
  SyntaxNode *local_50;
  SyntaxNode *local_40;
  size_t index_local;
  ClassMethodDeclarationSyntax *this_local;
  
  if (index == 0) {
    local_40 = (SyntaxNode *)0x0;
    if (this != (ClassMethodDeclarationSyntax *)0xfffffffffffffff0) {
      local_40 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_40);
  }
  else if (index == 1) {
    local_50 = (SyntaxNode *)0x0;
    if (this != (ClassMethodDeclarationSyntax *)0xffffffffffffffc0) {
      local_50 = &(this->qualifiers).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_50);
  }
  else if (index == 2) {
    node = not_null<slang::syntax::FunctionDeclarationSyntax_*>::get(&this->declaration);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(SyntaxNode *)node);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ClassMethodDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return &qualifiers;
        case 2: return declaration.get();
        default: return nullptr;
    }
}